

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_inherit_streams(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop_00;
  undefined1 auVar3 [16];
  uv_loop_t *loop;
  uv_write_t write_req;
  int bidir;
  int r;
  uint i;
  uv_buf_t buf;
  uchar ubuf [1023];
  uv_pipe_t pipe_stdout_parent;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_child;
  int fds_stdout [2];
  int fds_stdin [2];
  uv_stdio_container_t child_stdio [2];
  undefined1 local_90 [8];
  uv_process_t child_req;
  
  init_process_options("spawn_helper9",exit_cb);
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&pipe_stdout_child.pipe_fname,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x6f8,"uv_pipe_init(loop, &pipe_stdin_child, 0) == 0");
    abort();
  }
  iVar1 = uv_pipe_init(uVar2,&pipe_stdin_parent.pipe_fname,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x6f9,"uv_pipe_init(loop, &pipe_stdout_child, 0) == 0");
    abort();
  }
  iVar1 = uv_pipe_init(uVar2,&pipe_stdout_parent.pipe_fname,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x6fa,"uv_pipe_init(loop, &pipe_stdin_parent, 0) == 0");
    abort();
  }
  iVar1 = uv_pipe_init(uVar2,ubuf + 0x3f8,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x6fb,"uv_pipe_init(loop, &pipe_stdout_parent, 0) == 0");
    abort();
  }
  iVar1 = mpipe(fds_stdout);
  if (iVar1 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x6fd,"mpipe(fds_stdin) != -1");
    abort();
  }
  iVar1 = mpipe((int *)&pipe_stdin_child.pipe_fname);
  if (iVar1 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x6fe,"mpipe(fds_stdout) != -1");
    abort();
  }
  iVar1 = uv_pipe_open(&pipe_stdout_child.pipe_fname,fds_stdout[0]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x700,"uv_pipe_open(&pipe_stdin_child, fds_stdin[0]) == 0");
    abort();
  }
  iVar1 = uv_pipe_open(&pipe_stdin_parent.pipe_fname,pipe_stdin_child.pipe_fname._4_4_);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x701,"uv_pipe_open(&pipe_stdout_child, fds_stdout[1]) == 0");
    abort();
  }
  iVar1 = uv_pipe_open(&pipe_stdout_parent.pipe_fname,fds_stdout[1]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x702,"uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]) == 0");
    abort();
  }
  iVar1 = uv_pipe_open(ubuf + 0x3f8,pipe_stdin_child.pipe_fname._0_4_);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x703,"uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]) == 0");
    abort();
  }
  iVar1 = uv_is_readable(&pipe_stdout_child.pipe_fname);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x704,"uv_is_readable((uv_stream_t*) &pipe_stdin_child)");
    abort();
  }
  iVar1 = uv_is_writable(&pipe_stdin_parent.pipe_fname);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x705,"uv_is_writable((uv_stream_t*) &pipe_stdout_child)");
    abort();
  }
  iVar1 = uv_is_writable(&pipe_stdout_parent.pipe_fname);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x706,"uv_is_writable((uv_stream_t*) &pipe_stdin_parent)");
    abort();
  }
  iVar1 = uv_is_readable(ubuf + 0x3f8);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x707,"uv_is_readable((uv_stream_t*) &pipe_stdout_parent)");
    abort();
  }
  write_req.bufsml[3].len._4_4_ = uv_is_writable(&pipe_stdout_child.pipe_fname);
  iVar1 = uv_is_readable(&pipe_stdin_parent.pipe_fname);
  if (iVar1 != write_req.bufsml[3].len._4_4_) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x70a,"uv_is_readable((uv_stream_t*) &pipe_stdout_child) == bidir");
    abort();
  }
  iVar1 = uv_is_readable(&pipe_stdout_parent.pipe_fname);
  if (iVar1 != write_req.bufsml[3].len._4_4_) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x70b,"uv_is_readable((uv_stream_t*) &pipe_stdin_parent) == bidir");
    abort();
  }
  iVar1 = uv_is_writable(ubuf + 0x3f8);
  if (iVar1 != write_req.bufsml[3].len._4_4_) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x70c,"uv_is_writable((uv_stream_t*) &pipe_stdout_parent) == bidir");
    abort();
  }
  fds_stdin[0] = 4;
  options.stdio = (uv_stdio_container_t *)fds_stdin;
  options.stdio_count = 2;
  iVar1 = uv_spawn(uVar2,local_90,&options);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x717,"uv_spawn(loop, &child_req, &options) == 0");
    abort();
  }
  uv_close(&pipe_stdout_child.pipe_fname,0);
  uv_close(&pipe_stdin_parent.pipe_fname,0);
  auVar3 = uv_buf_init(&buf.len);
  buf.base = auVar3._8_8_;
  _r = auVar3._0_8_;
  for (bidir = 0; (uint)bidir < 0x3ff; bidir = bidir + 1) {
    ubuf[(ulong)(uint)bidir - 8] = (uchar)bidir;
  }
  memset(output,0,0x3ff);
  iVar1 = uv_write(&loop,&pipe_stdout_parent.pipe_fname,&r,1,write_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x726,"r == 0");
    abort();
  }
  iVar1 = uv_read_start(ubuf + 0x3f8,on_alloc,on_read);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x729,"r == 0");
    abort();
  }
  iVar1 = uv_run(uVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x72c,"r == 0");
    abort();
  }
  if (exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x72e,"exit_cb_called == 1");
    abort();
  }
  if (close_cb_called != 3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x72f,"close_cb_called == 3");
    abort();
  }
  iVar1 = memcmp(&buf.len,output,0x3ff);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x732,"r == 0");
    abort();
  }
  loop_00 = (uv_loop_t *)uv_default_loop();
  close_loop(loop_00);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x734,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(spawn_inherit_streams) {
  uv_process_t child_req;
  uv_stdio_container_t child_stdio[2];
  int fds_stdin[2];
  int fds_stdout[2];
  uv_pipe_t pipe_stdin_child;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_parent;
  unsigned char ubuf[OUTPUT_SIZE - 1];
  uv_buf_t buf;
  unsigned int i;
  int r;
  int bidir;
  uv_write_t write_req;
  uv_loop_t* loop;

  init_process_options("spawn_helper9", exit_cb);

  loop = uv_default_loop();
  ASSERT(uv_pipe_init(loop, &pipe_stdin_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdin_parent, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_parent, 0) == 0);

  ASSERT(mpipe(fds_stdin) != -1);
  ASSERT(mpipe(fds_stdout) != -1);

  ASSERT(uv_pipe_open(&pipe_stdin_child, fds_stdin[0]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_child, fds_stdout[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]) == 0);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdin_parent));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_parent));
  /* Some systems (SVR4) open a bidirectional pipe, most don't. */
  bidir = uv_is_writable((uv_stream_t*) &pipe_stdin_child);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_child) == bidir);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_parent) == bidir);
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_parent) == bidir);

  child_stdio[0].flags = UV_INHERIT_STREAM;
  child_stdio[0].data.stream = (uv_stream_t *)&pipe_stdin_child;

  child_stdio[1].flags = UV_INHERIT_STREAM;
  child_stdio[1].data.stream = (uv_stream_t *)&pipe_stdout_child;

  options.stdio = child_stdio;
  options.stdio_count = 2;

  ASSERT(uv_spawn(loop, &child_req, &options) == 0);

  uv_close((uv_handle_t*)&pipe_stdin_child, NULL);
  uv_close((uv_handle_t*)&pipe_stdout_child, NULL);

  buf = uv_buf_init((char*)ubuf, sizeof ubuf);
  for (i = 0; i < sizeof ubuf; ++i)
    ubuf[i] = i & 255u;
  memset(output, 0, sizeof ubuf);

  r = uv_write(&write_req,
               (uv_stream_t*)&pipe_stdin_parent,
               &buf,
               1,
               write_cb);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*)&pipe_stdout_parent, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 3);

  r = memcmp(ubuf, output, sizeof ubuf);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}